

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O3

QCollator * __thiscall QCollator::operator=(QCollator *this,QCollator *other)

{
  EVP_PKEY_CTX *ctx;
  QCollatorPrivate *pQVar1;
  
  if (this != other) {
    pQVar1 = this->d;
    ctx = (EVP_PKEY_CTX *)other;
    if (pQVar1 != (QCollatorPrivate *)0x0) {
      LOCK();
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        pQVar1 = this->d;
        if (pQVar1 != (QCollatorPrivate *)0x0) {
          QCollatorPrivate::~QCollatorPrivate(pQVar1);
        }
        ctx = (EVP_PKEY_CTX *)0x20;
        operator_delete(pQVar1,0x20);
      }
    }
    pQVar1 = other->d;
    this->d = pQVar1;
    if (pQVar1 != (QCollatorPrivate *)0x0) {
      if (pQVar1->dirty == true) {
        QCollatorPrivate::init(pQVar1,ctx);
        pQVar1 = this->d;
      }
      LOCK();
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

QCollator &QCollator::operator=(const QCollator &other)
{
    if (this != &other) {
        if (d && !d->ref.deref())
            delete d;
        d = other.d;
        if (d) {
            // Ensure clean, lest both copies try to init() at the same time:
            d->ensureInitialized();
            d->ref.ref();
        }
    }
    return *this;
}